

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TestCases.cpp
# Opt level: O0

void Test34(void)

{
  CMReturn In;
  CMReturn In_00;
  CMReturn In_01;
  CMReturn In_02;
  CMReturn In_03;
  CMOptions Options;
  undefined1 auVar1 [24];
  CMOptions Options_00;
  CMOptions Options_01;
  CMOptions Options_02;
  CMOptions Options_03;
  CMOptions Options_04;
  CMOptions Options_05;
  allocator<char> local_2979;
  string local_2978;
  allocator<char> local_2951;
  string local_2950;
  CMReturn local_2930;
  uint64_t local_2918;
  uint64_t uStack_2910;
  uint64_t local_2908;
  pointer local_28f8;
  undefined8 uStack_28f0;
  undefined8 local_28e8;
  undefined8 uStack_28e0;
  undefined8 local_28d8;
  undefined8 uStack_28d0;
  allocator<char> local_28b9;
  string local_28b8;
  allocator<char> local_2891;
  string local_2890;
  CMReturn local_2870;
  uint64_t local_2858;
  uint64_t uStack_2850;
  uint64_t local_2848;
  pointer local_2838;
  undefined8 uStack_2830;
  undefined8 local_2828;
  undefined8 uStack_2820;
  undefined8 local_2818;
  undefined8 uStack_2810;
  allocator<char> local_27f9;
  string local_27f8;
  allocator<char> local_27d1;
  string local_27d0;
  CMReturn local_27b0;
  uint64_t local_2798;
  uint64_t uStack_2790;
  uint64_t local_2788;
  pointer local_2778;
  undefined8 uStack_2770;
  undefined8 local_2768;
  undefined8 uStack_2760;
  undefined8 local_2758;
  undefined8 uStack_2750;
  allocator<char> local_2741;
  string local_2740;
  allocator<char> local_2719;
  string local_2718;
  CMReturn local_26f8;
  allocator<char> local_26d9;
  string local_26d8;
  string local_26b8;
  allocator<char> local_2691;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2690;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2670;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2650;
  int local_2630;
  allocator<char> local_2629;
  string local_2628;
  string local_2608;
  allocator<char> local_25e1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_25e0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_25c0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_25a0;
  int local_2580;
  allocator<char> local_2579;
  string local_2578;
  string local_2558;
  allocator<char> local_2531;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2530;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2510;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_24f0;
  _CM_RETURN_STATUS local_24cc;
  pointer local_24c8;
  undefined8 uStack_24c0;
  undefined8 local_24b8;
  undefined8 uStack_24b0;
  undefined8 local_24a8;
  undefined8 uStack_24a0;
  allocator<char> local_2491;
  string local_2490;
  allocator<char> local_2469;
  string local_2468;
  CMReturn local_2448;
  allocator<char> local_2429;
  string local_2428;
  string local_2408;
  allocator<char> local_23e1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_23e0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_23c0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_23a0;
  int local_2380;
  allocator<char> local_2379;
  string local_2378;
  string local_2358;
  allocator<char> local_2331;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2330;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2310;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_22f0;
  int local_22d0;
  allocator<char> local_22c9;
  string local_22c8;
  string local_22a8;
  allocator<char> local_2281;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2280;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2260;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2240;
  _CM_RETURN_STATUS local_221c;
  pointer local_2218;
  undefined8 uStack_2210;
  undefined8 local_2208;
  undefined8 uStack_2200;
  undefined8 local_21f8;
  undefined8 uStack_21f0;
  allocator<char> local_21d9;
  string local_21d8;
  allocator<char> local_21b1;
  string local_21b0;
  CMReturn local_2190;
  uint64_t local_2178;
  uint64_t uStack_2170;
  uint64_t local_2168;
  pointer local_2158;
  undefined8 uStack_2150;
  undefined8 local_2148;
  undefined8 uStack_2140;
  undefined8 local_2138;
  undefined8 uStack_2130;
  allocator<char> local_2121;
  string local_2120;
  allocator<char> local_20f9;
  string local_20f8;
  undefined1 auStack_20d8 [8];
  CMReturn res;
  unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_20b8;
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_2070;
  undefined1 local_2058 [8];
  ConfusableMatcher matcher;
  CMOptions opts;
  undefined1 local_20 [8];
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  map;
  
  std::
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::vector((vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            *)local_20);
  matcher.TheMap[0xff].
  super__Vector_base<std::pair<CMString,_google::dense_hash_map<char,_std::vector<CMString,_std::allocator<CMString>_>_*,_std::hash<char>,_std::equal_to<char>,_google::libc_allocator_with_realloc<std::pair<const_char,_std::vector<CMString,_std::allocator<CMString>_>_*>_>_>_*>,_std::allocator<std::pair<CMString,_google::dense_hash_map<char,_std::vector<CMString,_std::allocator<CMString>_>_*,_std::hash<char>,_std::equal_to<char>,_google::libc_allocator_with_realloc<std::pair<const_char,_std::vector<CMString,_std::allocator<CMString>_>_*>_>_>_*>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::vector(&local_2070,
           (vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            *)local_20);
  local_20b8._M_h._M_rehash_policy._M_max_load_factor = 0.0;
  local_20b8._M_h._M_rehash_policy._4_4_ = 0;
  local_20b8._M_h._M_rehash_policy._M_next_resize = 0;
  local_20b8._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  local_20b8._M_h._M_element_count = 0;
  local_20b8._M_h._M_buckets = (__buckets_ptr)0x0;
  local_20b8._M_h._M_bucket_count = 0;
  local_20b8._M_h._M_single_bucket = (__node_base_ptr)0x0;
  std::
  unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::unordered_set(&local_20b8);
  ConfusableMatcher::ConfusableMatcher((ConfusableMatcher *)local_2058,&local_2070,&local_20b8,true)
  ;
  std::
  unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unordered_set(&local_20b8);
  std::
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~vector(&local_2070);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_20f8,"SUPER",&local_20f9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_2120,"SUPER",&local_2121);
  local_2138 = 1;
  uStack_2130 = 0;
  local_2148 = 0;
  uStack_2140 = 1000000;
  local_2158 = matcher.TheMap[0xff].
               super__Vector_base<std::pair<CMString,_google::dense_hash_map<char,_std::vector<CMString,_std::allocator<CMString>_>_*,_std::hash<char>,_std::equal_to<char>,_google::libc_allocator_with_realloc<std::pair<const_char,_std::vector<CMString,_std::allocator<CMString>_>_*>_>_>_*>,_std::allocator<std::pair<CMString,_google::dense_hash_map<char,_std::vector<CMString,_std::allocator<CMString>_>_*,_std::hash<char>,_std::equal_to<char>,_google::libc_allocator_with_realloc<std::pair<const_char,_std::vector<CMString,_std::allocator<CMString>_>_*>_>_>_*>_>_>
               ._M_impl.super__Vector_impl_data._M_end_of_storage;
  uStack_2150 = 0;
  auVar1 = ZEXT824(matcher.TheMap[0xff].
                   super__Vector_base<std::pair<CMString,_google::dense_hash_map<char,_std::vector<CMString,_std::allocator<CMString>_>_*,_std::hash<char>,_std::equal_to<char>,_google::libc_allocator_with_realloc<std::pair<const_char,_std::vector<CMString,_std::allocator<CMString>_>_*>_>_>_*>,_std::allocator<std::pair<CMString,_google::dense_hash_map<char,_std::vector<CMString,_std::allocator<CMString>_>_*,_std::hash<char>,_std::equal_to<char>,_google::libc_allocator_with_realloc<std::pair<const_char,_std::vector<CMString,_std::allocator<CMString>_>_*>_>_>_*>_>_>
                   ._M_impl.super__Vector_impl_data._M_end_of_storage);
  Options.TimeoutNs = 1000000;
  Options.MatchRepeating = (bool)auVar1[0];
  Options._1_7_ = auVar1._1_7_;
  Options.StartIndex = auVar1._8_8_;
  Options.StartFromEnd = (bool)auVar1[0x10];
  Options._17_7_ = auVar1._17_7_;
  Options._32_8_ = 1;
  Options.ContainsPosPointers = (void *)0x0;
  ConfusableMatcher::IndexOf
            ((CMReturn *)auStack_20d8,(ConfusableMatcher *)local_2058,&local_20f8,&local_2120,
             Options);
  std::__cxx11::string::~string((string *)&local_2120);
  std::allocator<char>::~allocator(&local_2121);
  std::__cxx11::string::~string((string *)&local_20f8);
  std::allocator<char>::~allocator(&local_20f9);
  local_2168 = res.Size;
  local_2178 = (uint64_t)auStack_20d8;
  uStack_2170 = res.Start;
  In.Size = res.Start;
  In.Start = (uint64_t)auStack_20d8;
  In._16_8_ = res.Size;
  AssertMatch(In,0,5);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_21b0,"aSUPER",&local_21b1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_21d8,"SUPER",&local_21d9);
  local_21f8 = 1;
  uStack_21f0 = 0;
  local_2208 = 0;
  uStack_2200 = 1000000;
  local_2218 = matcher.TheMap[0xff].
               super__Vector_base<std::pair<CMString,_google::dense_hash_map<char,_std::vector<CMString,_std::allocator<CMString>_>_*,_std::hash<char>,_std::equal_to<char>,_google::libc_allocator_with_realloc<std::pair<const_char,_std::vector<CMString,_std::allocator<CMString>_>_*>_>_>_*>,_std::allocator<std::pair<CMString,_google::dense_hash_map<char,_std::vector<CMString,_std::allocator<CMString>_>_*,_std::hash<char>,_std::equal_to<char>,_google::libc_allocator_with_realloc<std::pair<const_char,_std::vector<CMString,_std::allocator<CMString>_>_*>_>_>_*>_>_>
               ._M_impl.super__Vector_impl_data._M_end_of_storage;
  uStack_2210 = 0;
  auVar1 = ZEXT824(matcher.TheMap[0xff].
                   super__Vector_base<std::pair<CMString,_google::dense_hash_map<char,_std::vector<CMString,_std::allocator<CMString>_>_*,_std::hash<char>,_std::equal_to<char>,_google::libc_allocator_with_realloc<std::pair<const_char,_std::vector<CMString,_std::allocator<CMString>_>_*>_>_>_*>,_std::allocator<std::pair<CMString,_google::dense_hash_map<char,_std::vector<CMString,_std::allocator<CMString>_>_*,_std::hash<char>,_std::equal_to<char>,_google::libc_allocator_with_realloc<std::pair<const_char,_std::vector<CMString,_std::allocator<CMString>_>_*>_>_>_*>_>_>
                   ._M_impl.super__Vector_impl_data._M_end_of_storage);
  Options_00.TimeoutNs = 1000000;
  Options_00.MatchRepeating = (bool)auVar1[0];
  Options_00._1_7_ = auVar1._1_7_;
  Options_00.StartIndex = auVar1._8_8_;
  Options_00.StartFromEnd = (bool)auVar1[0x10];
  Options_00._17_7_ = auVar1._17_7_;
  Options_00._32_8_ = 1;
  Options_00.ContainsPosPointers = (void *)0x0;
  ConfusableMatcher::IndexOf
            (&local_2190,(ConfusableMatcher *)local_2058,&local_21b0,&local_21d8,Options_00);
  res.Size = local_2190._16_8_;
  auStack_20d8 = (undefined1  [8])local_2190.Start;
  res.Start = local_2190.Size;
  std::__cxx11::string::~string((string *)&local_21d8);
  std::allocator<char>::~allocator(&local_21d9);
  std::__cxx11::string::~string((string *)&local_21b0);
  std::allocator<char>::~allocator(&local_21b1);
  local_221c = WORD_BOUNDARY_FAIL_START;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_2280,"Test34",&local_2281);
  std::operator+(&local_2260,&local_2280,": ");
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_22c8,"WORD_BOUNDARY_FAIL_START == res.Status",&local_22c9);
  cute::cute_to_string::backslashQuoteTabNewline(&local_22a8,&local_22c8);
  std::operator+(&local_2240,&local_2260,&local_22a8);
  cute::assert_equal<_CM_RETURN_STATUS,_CM_RETURN_STATUS>
            (&local_221c,(_CM_RETURN_STATUS *)&res.Size,&local_2240,
             "/workspace/llm4binary/github/license_all_cmakelists_25/TETYYS[P]ConfusableMatcher/UnitTests/TestCases.cpp"
             ,0x33e);
  std::__cxx11::string::~string((string *)&local_2240);
  std::__cxx11::string::~string((string *)&local_22a8);
  std::__cxx11::string::~string((string *)&local_22c8);
  std::allocator<char>::~allocator(&local_22c9);
  std::__cxx11::string::~string((string *)&local_2260);
  std::__cxx11::string::~string((string *)&local_2280);
  std::allocator<char>::~allocator(&local_2281);
  local_22d0 = 1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_2330,"Test34",&local_2331);
  std::operator+(&local_2310,&local_2330,": ");
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_2378,"1 == res.Start",&local_2379);
  cute::cute_to_string::backslashQuoteTabNewline(&local_2358,&local_2378);
  std::operator+(&local_22f0,&local_2310,&local_2358);
  cute::assert_equal<int,unsigned_long>
            (&local_22d0,(unsigned_long *)auStack_20d8,&local_22f0,
             "/workspace/llm4binary/github/license_all_cmakelists_25/TETYYS[P]ConfusableMatcher/UnitTests/TestCases.cpp"
             ,0x33f);
  std::__cxx11::string::~string((string *)&local_22f0);
  std::__cxx11::string::~string((string *)&local_2358);
  std::__cxx11::string::~string((string *)&local_2378);
  std::allocator<char>::~allocator(&local_2379);
  std::__cxx11::string::~string((string *)&local_2310);
  std::__cxx11::string::~string((string *)&local_2330);
  std::allocator<char>::~allocator(&local_2331);
  local_2380 = 5;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_23e0,"Test34",&local_23e1);
  std::operator+(&local_23c0,&local_23e0,": ");
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_2428,"5 == res.Size",&local_2429);
  cute::cute_to_string::backslashQuoteTabNewline(&local_2408,&local_2428);
  std::operator+(&local_23a0,&local_23c0,&local_2408);
  cute::assert_equal<int,unsigned_long>
            (&local_2380,&res.Start,&local_23a0,
             "/workspace/llm4binary/github/license_all_cmakelists_25/TETYYS[P]ConfusableMatcher/UnitTests/TestCases.cpp"
             ,0x340);
  std::__cxx11::string::~string((string *)&local_23a0);
  std::__cxx11::string::~string((string *)&local_2408);
  std::__cxx11::string::~string((string *)&local_2428);
  std::allocator<char>::~allocator(&local_2429);
  std::__cxx11::string::~string((string *)&local_23c0);
  std::__cxx11::string::~string((string *)&local_23e0);
  std::allocator<char>::~allocator(&local_23e1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_2468,"SUPERa",&local_2469);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_2490,"SUPER",&local_2491);
  local_24a8 = 1;
  uStack_24a0 = 0;
  local_24b8 = 0;
  uStack_24b0 = 1000000;
  local_24c8 = matcher.TheMap[0xff].
               super__Vector_base<std::pair<CMString,_google::dense_hash_map<char,_std::vector<CMString,_std::allocator<CMString>_>_*,_std::hash<char>,_std::equal_to<char>,_google::libc_allocator_with_realloc<std::pair<const_char,_std::vector<CMString,_std::allocator<CMString>_>_*>_>_>_*>,_std::allocator<std::pair<CMString,_google::dense_hash_map<char,_std::vector<CMString,_std::allocator<CMString>_>_*,_std::hash<char>,_std::equal_to<char>,_google::libc_allocator_with_realloc<std::pair<const_char,_std::vector<CMString,_std::allocator<CMString>_>_*>_>_>_*>_>_>
               ._M_impl.super__Vector_impl_data._M_end_of_storage;
  uStack_24c0 = 0;
  auVar1 = ZEXT824(matcher.TheMap[0xff].
                   super__Vector_base<std::pair<CMString,_google::dense_hash_map<char,_std::vector<CMString,_std::allocator<CMString>_>_*,_std::hash<char>,_std::equal_to<char>,_google::libc_allocator_with_realloc<std::pair<const_char,_std::vector<CMString,_std::allocator<CMString>_>_*>_>_>_*>,_std::allocator<std::pair<CMString,_google::dense_hash_map<char,_std::vector<CMString,_std::allocator<CMString>_>_*,_std::hash<char>,_std::equal_to<char>,_google::libc_allocator_with_realloc<std::pair<const_char,_std::vector<CMString,_std::allocator<CMString>_>_*>_>_>_*>_>_>
                   ._M_impl.super__Vector_impl_data._M_end_of_storage);
  Options_01.TimeoutNs = 1000000;
  Options_01.MatchRepeating = (bool)auVar1[0];
  Options_01._1_7_ = auVar1._1_7_;
  Options_01.StartIndex = auVar1._8_8_;
  Options_01.StartFromEnd = (bool)auVar1[0x10];
  Options_01._17_7_ = auVar1._17_7_;
  Options_01._32_8_ = 1;
  Options_01.ContainsPosPointers = (void *)0x0;
  ConfusableMatcher::IndexOf
            (&local_2448,(ConfusableMatcher *)local_2058,&local_2468,&local_2490,Options_01);
  res.Size = local_2448._16_8_;
  auStack_20d8 = (undefined1  [8])local_2448.Start;
  res.Start = local_2448.Size;
  std::__cxx11::string::~string((string *)&local_2490);
  std::allocator<char>::~allocator(&local_2491);
  std::__cxx11::string::~string((string *)&local_2468);
  std::allocator<char>::~allocator(&local_2469);
  local_24cc = WORD_BOUNDARY_FAIL_END;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_2530,"Test34",&local_2531);
  std::operator+(&local_2510,&local_2530,": ");
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_2578,"WORD_BOUNDARY_FAIL_END == res.Status",&local_2579);
  cute::cute_to_string::backslashQuoteTabNewline(&local_2558,&local_2578);
  std::operator+(&local_24f0,&local_2510,&local_2558);
  cute::assert_equal<_CM_RETURN_STATUS,_CM_RETURN_STATUS>
            (&local_24cc,(_CM_RETURN_STATUS *)&res.Size,&local_24f0,
             "/workspace/llm4binary/github/license_all_cmakelists_25/TETYYS[P]ConfusableMatcher/UnitTests/TestCases.cpp"
             ,0x343);
  std::__cxx11::string::~string((string *)&local_24f0);
  std::__cxx11::string::~string((string *)&local_2558);
  std::__cxx11::string::~string((string *)&local_2578);
  std::allocator<char>::~allocator(&local_2579);
  std::__cxx11::string::~string((string *)&local_2510);
  std::__cxx11::string::~string((string *)&local_2530);
  std::allocator<char>::~allocator(&local_2531);
  local_2580 = 0;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_25e0,"Test34",&local_25e1);
  std::operator+(&local_25c0,&local_25e0,": ");
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_2628,"0 == res.Start",&local_2629);
  cute::cute_to_string::backslashQuoteTabNewline(&local_2608,&local_2628);
  std::operator+(&local_25a0,&local_25c0,&local_2608);
  cute::assert_equal<int,unsigned_long>
            (&local_2580,(unsigned_long *)auStack_20d8,&local_25a0,
             "/workspace/llm4binary/github/license_all_cmakelists_25/TETYYS[P]ConfusableMatcher/UnitTests/TestCases.cpp"
             ,0x344);
  std::__cxx11::string::~string((string *)&local_25a0);
  std::__cxx11::string::~string((string *)&local_2608);
  std::__cxx11::string::~string((string *)&local_2628);
  std::allocator<char>::~allocator(&local_2629);
  std::__cxx11::string::~string((string *)&local_25c0);
  std::__cxx11::string::~string((string *)&local_25e0);
  std::allocator<char>::~allocator(&local_25e1);
  local_2630 = 5;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_2690,"Test34",&local_2691);
  std::operator+(&local_2670,&local_2690,": ");
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_26d8,"5 == res.Size",&local_26d9);
  cute::cute_to_string::backslashQuoteTabNewline(&local_26b8,&local_26d8);
  std::operator+(&local_2650,&local_2670,&local_26b8);
  cute::assert_equal<int,unsigned_long>
            (&local_2630,&res.Start,&local_2650,
             "/workspace/llm4binary/github/license_all_cmakelists_25/TETYYS[P]ConfusableMatcher/UnitTests/TestCases.cpp"
             ,0x345);
  std::__cxx11::string::~string((string *)&local_2650);
  std::__cxx11::string::~string((string *)&local_26b8);
  std::__cxx11::string::~string((string *)&local_26d8);
  std::allocator<char>::~allocator(&local_26d9);
  std::__cxx11::string::~string((string *)&local_2670);
  std::__cxx11::string::~string((string *)&local_2690);
  std::allocator<char>::~allocator(&local_2691);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_2718,"a SUPER",&local_2719);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_2740,"SUPER",&local_2741);
  local_2758 = 1;
  uStack_2750 = 0;
  local_2768 = 0;
  uStack_2760 = 1000000;
  local_2778 = matcher.TheMap[0xff].
               super__Vector_base<std::pair<CMString,_google::dense_hash_map<char,_std::vector<CMString,_std::allocator<CMString>_>_*,_std::hash<char>,_std::equal_to<char>,_google::libc_allocator_with_realloc<std::pair<const_char,_std::vector<CMString,_std::allocator<CMString>_>_*>_>_>_*>,_std::allocator<std::pair<CMString,_google::dense_hash_map<char,_std::vector<CMString,_std::allocator<CMString>_>_*,_std::hash<char>,_std::equal_to<char>,_google::libc_allocator_with_realloc<std::pair<const_char,_std::vector<CMString,_std::allocator<CMString>_>_*>_>_>_*>_>_>
               ._M_impl.super__Vector_impl_data._M_end_of_storage;
  uStack_2770 = 0;
  auVar1 = ZEXT824(matcher.TheMap[0xff].
                   super__Vector_base<std::pair<CMString,_google::dense_hash_map<char,_std::vector<CMString,_std::allocator<CMString>_>_*,_std::hash<char>,_std::equal_to<char>,_google::libc_allocator_with_realloc<std::pair<const_char,_std::vector<CMString,_std::allocator<CMString>_>_*>_>_>_*>,_std::allocator<std::pair<CMString,_google::dense_hash_map<char,_std::vector<CMString,_std::allocator<CMString>_>_*,_std::hash<char>,_std::equal_to<char>,_google::libc_allocator_with_realloc<std::pair<const_char,_std::vector<CMString,_std::allocator<CMString>_>_*>_>_>_*>_>_>
                   ._M_impl.super__Vector_impl_data._M_end_of_storage);
  Options_02.TimeoutNs = 1000000;
  Options_02.MatchRepeating = (bool)auVar1[0];
  Options_02._1_7_ = auVar1._1_7_;
  Options_02.StartIndex = auVar1._8_8_;
  Options_02.StartFromEnd = (bool)auVar1[0x10];
  Options_02._17_7_ = auVar1._17_7_;
  Options_02._32_8_ = 1;
  Options_02.ContainsPosPointers = (void *)0x0;
  ConfusableMatcher::IndexOf
            (&local_26f8,(ConfusableMatcher *)local_2058,&local_2718,&local_2740,Options_02);
  res.Size = local_26f8._16_8_;
  auStack_20d8 = (undefined1  [8])local_26f8.Start;
  res.Start = local_26f8.Size;
  std::__cxx11::string::~string((string *)&local_2740);
  std::allocator<char>::~allocator(&local_2741);
  std::__cxx11::string::~string((string *)&local_2718);
  std::allocator<char>::~allocator(&local_2719);
  local_2788 = res.Size;
  local_2798 = (uint64_t)auStack_20d8;
  uStack_2790 = res.Start;
  In_00.Size = res.Start;
  In_00.Start = (uint64_t)auStack_20d8;
  In_00._16_8_ = res.Size;
  AssertMatch(In_00,2,5);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_27d0,"SUPER a",&local_27d1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_27f8,"SUPER",&local_27f9);
  local_2818 = 1;
  uStack_2810 = 0;
  local_2828 = 0;
  uStack_2820 = 1000000;
  local_2838 = matcher.TheMap[0xff].
               super__Vector_base<std::pair<CMString,_google::dense_hash_map<char,_std::vector<CMString,_std::allocator<CMString>_>_*,_std::hash<char>,_std::equal_to<char>,_google::libc_allocator_with_realloc<std::pair<const_char,_std::vector<CMString,_std::allocator<CMString>_>_*>_>_>_*>,_std::allocator<std::pair<CMString,_google::dense_hash_map<char,_std::vector<CMString,_std::allocator<CMString>_>_*,_std::hash<char>,_std::equal_to<char>,_google::libc_allocator_with_realloc<std::pair<const_char,_std::vector<CMString,_std::allocator<CMString>_>_*>_>_>_*>_>_>
               ._M_impl.super__Vector_impl_data._M_end_of_storage;
  uStack_2830 = 0;
  auVar1 = ZEXT824(matcher.TheMap[0xff].
                   super__Vector_base<std::pair<CMString,_google::dense_hash_map<char,_std::vector<CMString,_std::allocator<CMString>_>_*,_std::hash<char>,_std::equal_to<char>,_google::libc_allocator_with_realloc<std::pair<const_char,_std::vector<CMString,_std::allocator<CMString>_>_*>_>_>_*>,_std::allocator<std::pair<CMString,_google::dense_hash_map<char,_std::vector<CMString,_std::allocator<CMString>_>_*,_std::hash<char>,_std::equal_to<char>,_google::libc_allocator_with_realloc<std::pair<const_char,_std::vector<CMString,_std::allocator<CMString>_>_*>_>_>_*>_>_>
                   ._M_impl.super__Vector_impl_data._M_end_of_storage);
  Options_03.TimeoutNs = 1000000;
  Options_03.MatchRepeating = (bool)auVar1[0];
  Options_03._1_7_ = auVar1._1_7_;
  Options_03.StartIndex = auVar1._8_8_;
  Options_03.StartFromEnd = (bool)auVar1[0x10];
  Options_03._17_7_ = auVar1._17_7_;
  Options_03._32_8_ = 1;
  Options_03.ContainsPosPointers = (void *)0x0;
  ConfusableMatcher::IndexOf
            (&local_27b0,(ConfusableMatcher *)local_2058,&local_27d0,&local_27f8,Options_03);
  res.Size = local_27b0._16_8_;
  auStack_20d8 = (undefined1  [8])local_27b0.Start;
  res.Start = local_27b0.Size;
  std::__cxx11::string::~string((string *)&local_27f8);
  std::allocator<char>::~allocator(&local_27f9);
  std::__cxx11::string::~string((string *)&local_27d0);
  std::allocator<char>::~allocator(&local_27d1);
  local_2848 = res.Size;
  local_2858 = (uint64_t)auStack_20d8;
  uStack_2850 = res.Start;
  In_01.Size = res.Start;
  In_01.Start = (uint64_t)auStack_20d8;
  In_01._16_8_ = res.Size;
  AssertMatch(In_01,0,5);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_2890,"SUPER;duper",&local_2891);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_28b8,"SUPER",&local_28b9);
  local_28d8 = 1;
  uStack_28d0 = 0;
  local_28e8 = 0;
  uStack_28e0 = 1000000;
  local_28f8 = matcher.TheMap[0xff].
               super__Vector_base<std::pair<CMString,_google::dense_hash_map<char,_std::vector<CMString,_std::allocator<CMString>_>_*,_std::hash<char>,_std::equal_to<char>,_google::libc_allocator_with_realloc<std::pair<const_char,_std::vector<CMString,_std::allocator<CMString>_>_*>_>_>_*>,_std::allocator<std::pair<CMString,_google::dense_hash_map<char,_std::vector<CMString,_std::allocator<CMString>_>_*,_std::hash<char>,_std::equal_to<char>,_google::libc_allocator_with_realloc<std::pair<const_char,_std::vector<CMString,_std::allocator<CMString>_>_*>_>_>_*>_>_>
               ._M_impl.super__Vector_impl_data._M_end_of_storage;
  uStack_28f0 = 0;
  auVar1 = ZEXT824(matcher.TheMap[0xff].
                   super__Vector_base<std::pair<CMString,_google::dense_hash_map<char,_std::vector<CMString,_std::allocator<CMString>_>_*,_std::hash<char>,_std::equal_to<char>,_google::libc_allocator_with_realloc<std::pair<const_char,_std::vector<CMString,_std::allocator<CMString>_>_*>_>_>_*>,_std::allocator<std::pair<CMString,_google::dense_hash_map<char,_std::vector<CMString,_std::allocator<CMString>_>_*,_std::hash<char>,_std::equal_to<char>,_google::libc_allocator_with_realloc<std::pair<const_char,_std::vector<CMString,_std::allocator<CMString>_>_*>_>_>_*>_>_>
                   ._M_impl.super__Vector_impl_data._M_end_of_storage);
  Options_04.TimeoutNs = 1000000;
  Options_04.MatchRepeating = (bool)auVar1[0];
  Options_04._1_7_ = auVar1._1_7_;
  Options_04.StartIndex = auVar1._8_8_;
  Options_04.StartFromEnd = (bool)auVar1[0x10];
  Options_04._17_7_ = auVar1._17_7_;
  Options_04._32_8_ = 1;
  Options_04.ContainsPosPointers = (void *)0x0;
  ConfusableMatcher::IndexOf
            (&local_2870,(ConfusableMatcher *)local_2058,&local_2890,&local_28b8,Options_04);
  res.Size = local_2870._16_8_;
  auStack_20d8 = (undefined1  [8])local_2870.Start;
  res.Start = local_2870.Size;
  std::__cxx11::string::~string((string *)&local_28b8);
  std::allocator<char>::~allocator(&local_28b9);
  std::__cxx11::string::~string((string *)&local_2890);
  std::allocator<char>::~allocator(&local_2891);
  local_2908 = res.Size;
  local_2918 = (uint64_t)auStack_20d8;
  uStack_2910 = res.Start;
  In_02.Size = res.Start;
  In_02.Start = (uint64_t)auStack_20d8;
  In_02._16_8_ = res.Size;
  AssertMatch(In_02,0,5);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_2950,anon_var_dwarf_17429 + 3,&local_2951);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_2978,"SUPER",&local_2979);
  auVar1 = ZEXT824(matcher.TheMap[0xff].
                   super__Vector_base<std::pair<CMString,_google::dense_hash_map<char,_std::vector<CMString,_std::allocator<CMString>_>_*,_std::hash<char>,_std::equal_to<char>,_google::libc_allocator_with_realloc<std::pair<const_char,_std::vector<CMString,_std::allocator<CMString>_>_*>_>_>_*>,_std::allocator<std::pair<CMString,_google::dense_hash_map<char,_std::vector<CMString,_std::allocator<CMString>_>_*,_std::hash<char>,_std::equal_to<char>,_google::libc_allocator_with_realloc<std::pair<const_char,_std::vector<CMString,_std::allocator<CMString>_>_*>_>_>_*>_>_>
                   ._M_impl.super__Vector_impl_data._M_end_of_storage);
  Options_05.TimeoutNs = 1000000;
  Options_05.MatchRepeating = (bool)auVar1[0];
  Options_05._1_7_ = auVar1._1_7_;
  Options_05.StartIndex = auVar1._8_8_;
  Options_05.StartFromEnd = (bool)auVar1[0x10];
  Options_05._17_7_ = auVar1._17_7_;
  Options_05._32_8_ = 1;
  Options_05.ContainsPosPointers = (void *)0x0;
  ConfusableMatcher::IndexOf
            (&local_2930,(ConfusableMatcher *)local_2058,&local_2950,&local_2978,Options_05);
  res.Size = local_2930._16_8_;
  auStack_20d8 = (undefined1  [8])local_2930.Start;
  res.Start = local_2930.Size;
  std::__cxx11::string::~string((string *)&local_2978);
  std::allocator<char>::~allocator(&local_2979);
  std::__cxx11::string::~string((string *)&local_2950);
  std::allocator<char>::~allocator(&local_2951);
  In_03.Size = res.Start;
  In_03.Start = (uint64_t)auStack_20d8;
  In_03._16_8_ = res.Size;
  AssertMatch(In_03,6,5);
  ConfusableMatcher::~ConfusableMatcher((ConfusableMatcher *)local_2058);
  std::
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~vector((vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             *)local_20);
  return;
}

Assistant:

void Test34()
{
	std::vector<std::pair<std::string, std::string>> map;

	CMOptions opts = { };
	opts.TimeoutNs = 1000000;
	opts.MatchOnWordBoundary = true;

	auto matcher = ConfusableMatcher(map, {});
	auto res = matcher.IndexOf("SUPER", "SUPER", opts);
	AssertMatch(res, 0, 5);

	res = matcher.IndexOf("aSUPER", "SUPER", opts);
	ASSERT_EQUAL(WORD_BOUNDARY_FAIL_START, res.Status);
	ASSERT_EQUAL(1, res.Start);
	ASSERT_EQUAL(5, res.Size);

	res = matcher.IndexOf("SUPERa", "SUPER", opts);
	ASSERT_EQUAL(WORD_BOUNDARY_FAIL_END, res.Status);
	ASSERT_EQUAL(0, res.Start);
	ASSERT_EQUAL(5, res.Size);

	res = matcher.IndexOf("a SUPER", "SUPER", opts);
	AssertMatch(res, 2, 5);

	res = matcher.IndexOf("SUPER a", "SUPER", opts);
	AssertMatch(res, 0, 5);

	res = matcher.IndexOf("SUPER;duper", "SUPER", opts);
	AssertMatch(res, 0, 5);

	res = matcher.IndexOf("yes\u202FSUPER", "SUPER", opts);
	AssertMatch(res, 6, 5);
}